

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

QAction * __thiscall QMenuPrivate::actionAt(QMenuPrivate *this,QPoint p)

{
  char cVar1;
  QAction *pQVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QRect local_48;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = p;
  local_48 = rect(this);
  pQVar2 = (QAction *)0x0;
  cVar1 = QRect::contains((QPoint *)&local_48,SUB81(&local_38,0));
  if (cVar1 != '\0') {
    if ((this->actionRects).d.size == 0) {
      pQVar2 = (QAction *)0x0;
    }
    else {
      pQVar2 = (QAction *)0x0;
      lVar4 = 0;
      uVar3 = 0;
      do {
        cVar1 = QRect::contains((QPoint *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar4),
                                SUB81(&local_38,0));
        if (cVar1 != '\0') {
          pQVar2 = (this->super_QWidgetPrivate).actions.d.ptr[uVar3];
          break;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < (ulong)(this->actionRects).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QAction *QMenuPrivate::actionAt(QPoint p) const
{
    if (!rect().contains(p))     //sanity check
       return nullptr;

    for(int i = 0; i < actionRects.size(); i++) {
        if (actionRects.at(i).contains(p))
            return actions.at(i);
    }
    return nullptr;
}